

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O2

int __thiscall Centaurus::PriorityChain::compare(PriorityChain *this,PriorityChain *chain)

{
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  PriorityChainElement *this_00;
  PriorityChainElement *e;
  
  uVar7 = 0xffffffffffffffff;
  lVar6 = 0;
  do {
    pPVar1 = (this->
             super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
             ).
             super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->
                   super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                   ).
                   super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x30;
    pPVar2 = (chain->
             super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
             ).
             super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(chain->
                   super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                   ).
                   super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x30;
    if (uVar5 < uVar4) {
      uVar4 = uVar5;
    }
    uVar7 = uVar7 + 1;
    if (uVar4 <= uVar7) {
      return 0;
    }
    this_00 = (PriorityChainElement *)((long)&(pPVar1->m_id)._vptr_Identifier + lVar6);
    e = (PriorityChainElement *)((long)&(pPVar2->m_id)._vptr_Identifier + lVar6);
    bVar3 = PriorityChainElement::operator<(this_00,e);
    if (bVar3) {
      return -1;
    }
    lVar6 = lVar6 + 0x30;
    bVar3 = PriorityChainElement::operator>(this_00,e);
  } while (!bVar3);
  return 1;
}

Assistant:

int compare(const PriorityChain& chain) const
    {
        for (int i = 0; i < std::min(size(), chain.size()); i++)
        {
            const PriorityChainElement& p = this->operator[](i);
            const PriorityChainElement& q = chain[i];

            if (p < q) return -1;
            if (p > q) return +1;
        }
        return 0;
    }